

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSecureDelete(Btree *p,int newFlag)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  
  if (p == (Btree *)0x0) {
    uVar3 = 0;
  }
  else {
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    uVar2 = p->pBt->btsFlags;
    uVar3 = (uint)uVar2;
    if (-1 < newFlag) {
      uVar3 = newFlag << 2 | uVar2 & 0xfffffff3;
      p->pBt->btsFlags = (u16)uVar3;
    }
    uVar3 = uVar3 >> 2 & 3;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSecureDelete(Btree *p, int newFlag){
  int b;
  if( p==0 ) return 0;
  sqlite3BtreeEnter(p);
  assert( BTS_OVERWRITE==BTS_SECURE_DELETE*2 );
  assert( BTS_FAST_SECURE==(BTS_OVERWRITE|BTS_SECURE_DELETE) );
  if( newFlag>=0 ){
    p->pBt->btsFlags &= ~BTS_FAST_SECURE;
    p->pBt->btsFlags |= BTS_SECURE_DELETE*newFlag;
  }
  b = (p->pBt->btsFlags & BTS_FAST_SECURE)/BTS_SECURE_DELETE;
  sqlite3BtreeLeave(p);
  return b;
}